

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O3

avl_node * avl_find(avl_tree *tree,void *key)

{
  _func_int_void_ptr_void_ptr *p_Var1;
  int iVar2;
  avl_node *paVar3;
  
  paVar3 = tree->root;
  if (paVar3 != (avl_node *)0x0) {
    p_Var1 = tree->comp;
    do {
      iVar2 = (*p_Var1)(key,paVar3->key);
      if (iVar2 < 0) {
        paVar3 = paVar3->left;
      }
      else {
        if (iVar2 == 0) {
          return paVar3;
        }
        paVar3 = paVar3->right;
      }
    } while (paVar3 != (avl_node *)0x0);
  }
  return (avl_node *)0x0;
}

Assistant:

struct avl_node *
avl_find(const struct avl_tree *tree, const void *key) {
  struct avl_node *node;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  return diff == 0 ? node : NULL;
}